

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O3

void __thiscall helics::apps::Player::sortTags(Player *this)

{
  string *__k;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  __normal_iterator<helics::apps::ValueSetter_*,_std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>_>
  __first;
  __normal_iterator<helics::apps::ValueSetter_*,_std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>_>
  __last;
  __normal_iterator<helics::apps::MessageHolder_*,_std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>_>
  __first_00;
  __normal_iterator<helics::apps::MessageHolder_*,_std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>_>
  __last_00;
  pointer pVVar1;
  pointer pMVar2;
  long lVar3;
  ulong uVar4;
  iterator iVar5;
  mapped_type *this_01;
  ValueSetter *vs;
  pointer pVVar6;
  MessageHolder *ms;
  pointer pMVar7;
  
  __first._M_current =
       (this->points).
       super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>.
       _M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (this->points).
       super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    uVar4 = (long)__last._M_current - (long)__first._M_current >> 7;
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<helics::apps::ValueSetter*,std::vector<helics::apps::ValueSetter,std::allocator<helics::apps::ValueSetter>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(helics::apps::ValueSetter_const&,helics::apps::ValueSetter_const&)>>
              (__first,__last,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_helics::apps::ValueSetter_&,_const_helics::apps::ValueSetter_&)>
                )0x181e2d);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<helics::apps::ValueSetter*,std::vector<helics::apps::ValueSetter,std::allocator<helics::apps::ValueSetter>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(helics::apps::ValueSetter_const&,helics::apps::ValueSetter_const&)>>
              (__first,__last,
               (_Iter_comp_iter<bool_(*)(const_helics::apps::ValueSetter_&,_const_helics::apps::ValueSetter_&)>
                )0x181e2d);
  }
  __first_00._M_current =
       (this->messages).
       super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
       ._M_impl.super__Vector_impl_data._M_start;
  __last_00._M_current =
       (this->messages).
       super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__first_00._M_current != __last_00._M_current) {
    uVar4 = ((long)__last_00._M_current - (long)__first_00._M_current >> 4) * -0xf0f0f0f0f0f0f0f;
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<helics::apps::MessageHolder*,std::vector<helics::apps::MessageHolder,std::allocator<helics::apps::MessageHolder>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(helics::apps::MessageHolder_const&,helics::apps::MessageHolder_const&)>>
              (__first_00,__last_00,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_helics::apps::MessageHolder_&,_const_helics::apps::MessageHolder_&)>
                )0x181e47);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<helics::apps::MessageHolder*,std::vector<helics::apps::MessageHolder,std::allocator<helics::apps::MessageHolder>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(helics::apps::MessageHolder_const&,helics::apps::MessageHolder_const&)>>
              (__first_00,__last_00,
               (_Iter_comp_iter<bool_(*)(const_helics::apps::MessageHolder_&,_const_helics::apps::MessageHolder_&)>
                )0x181e47);
  }
  pVVar6 = (this->points).
           super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar1 = (this->points).
           super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pVVar6 != pVVar1) {
    this_00 = &this->tags;
    do {
      __k = &pVVar6->pubName;
      iVar5 = CLI::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&this_00->_M_h,__k);
      if (iVar5.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::__cxx11::string&,std::__cxx11::string&>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)this_00,__k,&pVVar6->type);
      }
      else if (*(long *)((long)iVar5.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                               ._M_cur + 0x30) == 0) {
        this_01 = CLI::std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_00,__k);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign(this_01,&pVVar6->type);
      }
      pVVar6 = pVVar6 + 1;
    } while (pVVar6 != pVVar1);
  }
  pMVar7 = (this->messages).
           super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar2 = (this->messages).
           super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar7 != pMVar2) {
    do {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_emplace_unique<std::__cxx11::string&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->epts,&(pMVar7->mess).source);
      pMVar7 = pMVar7 + 1;
    } while (pMVar7 != pMVar2);
  }
  return;
}

Assistant:

void Player::sortTags()
{
    std::sort(points.begin(), points.end(), vComp);
    std::sort(messages.begin(), messages.end(), mComp);
    // collapse tags to the reduced list
    for (auto& vs : points) {
        auto fnd = tags.find(vs.pubName);
        if (fnd != tags.end()) {
            if (fnd->second.empty()) {
                tags[vs.pubName] = vs.type;
            }
        } else {
            tags.emplace(vs.pubName, vs.type);
        }
    }

    for (auto& ms : messages) {
        epts.emplace(ms.mess.source);
    }
}